

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_reverse_meta(lyd_node *node,lys_module *mod,char *name1,char *name2)

{
  lyd_meta *meta;
  char *pcVar1;
  lyd_meta *meta_00;
  char *pcVar2;
  ly_ctx *local_78;
  ly_ctx *local_70;
  char *__path_1;
  char *__path;
  char *val2;
  char *val1;
  lyd_meta *meta2;
  lyd_meta *meta1;
  LY_ERR ret;
  char *name2_local;
  char *name1_local;
  lys_module *mod_local;
  lyd_node *node_local;
  
  meta = lyd_find_meta(node->meta,mod,name1);
  if (meta == (lyd_meta *)0x0) {
    pcVar1 = lyd_path(node,LYD_PATH_STD,(char *)0x0,0);
    if (node->schema == (lysc_node *)0x0) {
      local_70 = (ly_ctx *)node[2].schema;
    }
    else {
      local_70 = node->schema->module->ctx;
    }
    ly_log(local_70,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",name1,
           pcVar1);
    free(pcVar1);
    node_local._4_4_ = LY_EINVAL;
  }
  else {
    meta_00 = lyd_find_meta(node->meta,mod,name2);
    if (meta_00 == (lyd_meta *)0x0) {
      pcVar1 = lyd_path(node,LYD_PATH_STD,(char *)0x0,0);
      if (node->schema == (lysc_node *)0x0) {
        local_78 = (ly_ctx *)node[2].schema;
      }
      else {
        local_78 = node->schema->module->ctx;
      }
      ly_log(local_78,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",name2,
             pcVar1);
      free(pcVar1);
      node_local._4_4_ = LY_EINVAL;
    }
    else {
      pcVar1 = lyd_get_meta_value(meta);
      pcVar2 = lyd_get_meta_value(meta_00);
      pcVar2 = strdup(pcVar2);
      meta1._4_4_ = lyd_change_meta(meta,pcVar2);
      if (meta1._4_4_ == LY_SUCCESS) {
        meta1._4_4_ = lyd_change_meta(meta_00,pcVar1);
      }
      free(pcVar2);
      node_local._4_4_ = meta1._4_4_;
    }
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
lyd_diff_reverse_meta(struct lyd_node *node, const struct lys_module *mod, const char *name1, const char *name2)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *meta1, *meta2;
    const char *val1 = NULL;
    char *val2 = NULL;

    meta1 = lyd_find_meta(node->meta, mod, name1);
    LY_CHECK_ERR_RET(!meta1, LOGERR_META(LYD_CTX(node), name1, node), LY_EINVAL);

    meta2 = lyd_find_meta(node->meta, mod, name2);
    LY_CHECK_ERR_RET(!meta2, LOGERR_META(LYD_CTX(node), name2, node), LY_EINVAL);

    /* value1 */
    val1 = lyd_get_meta_value(meta1);

    /* value2 */
    val2 = strdup(lyd_get_meta_value(meta2));

    /* switch values */
    LY_CHECK_GOTO(ret = lyd_change_meta(meta1, val2), cleanup);
    LY_CHECK_GOTO(ret = lyd_change_meta(meta2, val1), cleanup);

cleanup:
    free(val2);
    return ret;
}